

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool run_bitset_container_xor(run_container_t *src_1,bitset_container_t *src_2,container_t **dst)

{
  ushort uVar1;
  ushort uVar2;
  rle16_t *prVar3;
  uint64_t *puVar4;
  uint uVar5;
  int iVar6;
  bitset_container_t *bitset;
  array_container_t *paVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  
  bitset = bitset_container_create();
  bitset->cardinality = src_2->cardinality;
  memcpy(bitset->words,src_2->words,0x2000);
  iVar6 = src_1->n_runs;
  if (0 < (long)iVar6) {
    prVar3 = src_1->runs;
    puVar4 = bitset->words;
    lVar9 = 0;
    do {
      uVar1 = prVar3[lVar9].value;
      uVar2 = prVar3[lVar9].length;
      if ((uint)uVar2 + (uint)uVar1 + 1 != (uint)uVar1) {
        uVar5 = (uint)uVar2 + (uint)uVar1;
        uVar10 = (ulong)(uint)(uVar1 >> 6);
        uVar8 = uVar5 >> 6;
        puVar4[uVar10] = ~(-1L << ((byte)uVar1 & 0x3f) ^ puVar4[uVar10]);
        if (uVar1 >> 6 < uVar8) {
          do {
            puVar4[uVar10] = ~puVar4[uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar8 != uVar10);
        }
        puVar4[uVar8] = puVar4[uVar8] ^ 0xffffffffffffffffU >> (~(byte)uVar5 & 0x3f);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar6);
  }
  iVar6 = bitset_container_compute_cardinality(bitset);
  bitset->cardinality = iVar6;
  if (iVar6 < 0x1001) {
    paVar7 = array_container_from_bitset(bitset);
    *dst = paVar7;
    bitset_container_free(bitset);
  }
  else {
    *dst = bitset;
  }
  return 0x1000 < iVar6;
}

Assistant:

bool run_bitset_container_xor(
    const run_container_t *src_1, const bitset_container_t *src_2,
    container_t **dst
){
    bitset_container_t *result = bitset_container_create();

    bitset_container_copy(src_2, result);
    for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
        rle16_t rle = src_1->runs[rlepos];
        bitset_flip_range(result->words, rle.value,
                          rle.value + rle.length + UINT32_C(1));
    }
    result->cardinality = bitset_container_compute_cardinality(result);

    if (result->cardinality <= DEFAULT_MAX_SIZE) {
        *dst = array_container_from_bitset(result);
        bitset_container_free(result);
        return false;  // not bitset
    }
    *dst = result;
    return true;  // bitset
}